

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::IncludeScope::EnforceCMP0011(IncludeScope *this)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  PolicyID id;
  PolicyID id_00;
  string sStack_1c8;
  string local_1a8;
  ostringstream e;
  
  PVar2 = cmState::Snapshot::GetPolicy(&this->Makefile->StateSnapshot,CMP0011);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&sStack_1c8,(cmPolicies *)0xb,id);
    poVar3 = std::operator<<((ostream *)&e,(string *)&sStack_1c8);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"The included script\n  ");
    GetExecutionFilePath_abi_cxx11_(&local_1a8,this->Makefile);
    poVar3 = std::operator<<(poVar3,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"affects policy settings, so it requires this policy to be set.");
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    IssueMessage(pcVar1,FATAL_ERROR,&sStack_1c8,false);
  }
  else {
    if (PVar2 != WARN) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1c8,(cmPolicies *)0xb,id_00);
    poVar3 = std::operator<<((ostream *)&e,(string *)&sStack_1c8);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"The included script\n  ");
    GetExecutionFilePath_abi_cxx11_(&local_1a8,this->Makefile);
    poVar3 = std::operator<<(poVar3,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"affects policy settings.  ");
    poVar3 = std::operator<<(poVar3,
                             "CMake is implying the NO_POLICY_SCOPE option for compatibility, ");
    std::operator<<(poVar3,"so the effects are applied to the including context.");
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    IssueMessage(pcVar1,AUTHOR_WARNING,&sStack_1c8,false);
  }
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmMakefile::IncludeScope::EnforceCMP0011()
{
  // We check the setting of this policy again because the included
  // script might actually set this policy for its includer.
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011))
    {
    case cmPolicies::WARN:
      // Warn because the user did not set this policy.
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0011) << "\n"
        << "The included script\n  "
        << this->Makefile->GetExecutionFilePath() << "\n"
        << "affects policy settings.  "
        << "CMake is implying the NO_POLICY_SCOPE option for compatibility, "
        << "so the effects are applied to the including context.";
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      {
      std::ostringstream e;
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0011) << "\n"
        << "The included script\n  "
        << this->Makefile->GetExecutionFilePath() << "\n"
        << "affects policy settings, so it requires this policy to be set.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
      break;
    case cmPolicies::OLD:
    case cmPolicies::NEW:
      // The script set this policy.  We assume the purpose of the
      // script is to initialize policies for its includer, and since
      // the policy is now set for later scripts, we do not warn.
      break;
    }
}